

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdInt8x16OperationX86X64.cpp
# Opt level: O3

SIMDValue Js::SIMDInt8x16Operation::OpNotEqual(SIMDValue *aValue,SIMDValue *bValue)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  
  auVar2[0] = -((bValue->field_0).i8[0] == (aValue->field_0).i8[0]);
  auVar2[1] = -((bValue->field_0).i8[1] == (aValue->field_0).i8[1]);
  auVar2[2] = -((bValue->field_0).i8[2] == (aValue->field_0).i8[2]);
  auVar2[3] = -((bValue->field_0).i8[3] == (aValue->field_0).i8[3]);
  auVar2[4] = -((bValue->field_0).i8[4] == (aValue->field_0).i8[4]);
  auVar2[5] = -((bValue->field_0).i8[5] == (aValue->field_0).i8[5]);
  auVar2[6] = -((bValue->field_0).i8[6] == (aValue->field_0).i8[6]);
  auVar2[7] = -((bValue->field_0).i8[7] == (aValue->field_0).i8[7]);
  auVar2[8] = -((bValue->field_0).i8[8] == (aValue->field_0).i8[8]);
  auVar2[9] = -((bValue->field_0).i8[9] == (aValue->field_0).i8[9]);
  auVar2[10] = -((bValue->field_0).i8[10] == (aValue->field_0).i8[10]);
  auVar2[0xb] = -((bValue->field_0).i8[0xb] == (aValue->field_0).i8[0xb]);
  auVar2[0xc] = -((bValue->field_0).i8[0xc] == (aValue->field_0).i8[0xc]);
  auVar2[0xd] = -((bValue->field_0).i8[0xd] == (aValue->field_0).i8[0xd]);
  auVar2[0xe] = -((bValue->field_0).i8[0xe] == (aValue->field_0).i8[0xe]);
  auVar2[0xf] = -((bValue->field_0).i8[0xf] == (aValue->field_0).i8[0xf]);
  auVar1._8_4_ = 0xffffffff;
  auVar1._0_8_ = 0xffffffffffffffff;
  auVar1._12_4_ = 0xffffffff;
  return (SIMDValue)(anon_union_16_9_4d7543c8_for__SIMDValue_0)(auVar1 ^ auVar2);
}

Assistant:

SIMDValue SIMDInt8x16Operation::OpNotEqual(const SIMDValue& aValue, const SIMDValue& bValue)
    {
        X86SIMDValue x86Result;
        X86SIMDValue tmpaValue = X86SIMDValue::ToX86SIMDValue(aValue);
        X86SIMDValue tmpbValue = X86SIMDValue::ToX86SIMDValue(bValue);
        x86Result.m128i_value = _mm_cmpeq_epi8(tmpaValue.m128i_value, tmpbValue.m128i_value); // compare a != b?

        X86SIMDValue negativeOnes = { { -1, -1, -1, -1 } };
        x86Result.m128i_value = _mm_andnot_si128(x86Result.m128i_value, negativeOnes.m128i_value);

        return X86SIMDValue::ToSIMDValue(x86Result);
    }